

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::anon_unknown_7::LineBufferTask::execute(LineBufferTask *this)

{
  int *piVar1;
  pointer ppLVar2;
  char *pcVar3;
  long *plVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  LineBuffer *pLVar8;
  ulong uVar9;
  Data *pDVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  long lVar13;
  int y;
  int x;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  int i;
  long lVar17;
  long lVar18;
  long lVar19;
  long size;
  ulong uVar20;
  int local_54;
  char *writePtr;
  char *compPtr;
  char *local_40;
  char *ptr;
  
  pDVar10 = this->_ofd;
  pLVar8 = this->_lineBuffer;
  if (*(int *)&(pDVar10->bytesPerLine).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish == 0) {
    iVar6 = *(int *)&pLVar8->_sem;
    iVar7 = *(int *)&pLVar8->field_0x6c;
    iVar14 = iVar7 + 1;
    local_54 = 1;
    x = iVar6;
  }
  else {
    iVar6 = *(int *)&pLVar8->_sem;
    iVar7 = *(int *)&pLVar8->field_0x6c;
    iVar14 = iVar6 + -1;
    local_54 = -1;
    x = iVar7;
  }
  bytesPerDeepLineTable
            (&pDVar10->header,iVar6,iVar7,*(char **)&pDVar10[1].header._map._M_t._M_impl,
             pDVar10[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color,
             *(int *)&pDVar10[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pDVar10->slices);
  pLVar8 = this->_lineBuffer;
  for (lVar18 = (long)*(int *)&pLVar8->_sem; lVar18 <= *(int *)&pLVar8->field_0x6c;
      lVar18 = lVar18 + 1) {
    Array<char>::resizeErase
              ((Array<char> *)
               ((pLVar8->buffer)._data +
               (lVar18 - *(int *)((long)&(pLVar8->exception).field_2 + 8)) * 0x10),
               *(long *)((long)(this->_ofd->slices).
                               super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                        (lVar18 - *(int *)((long)&(this->_ofd->bytesPerLine).
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * 8));
    pDVar10 = this->_ofd;
    for (lVar13 = (long)*(int *)((long)&(pDVar10->bytesPerLine).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 4);
        lVar13 <= *(int *)&(pDVar10->bytesPerLine).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage; lVar13 = lVar13 + 1) {
      piVar1 = (int *)((long)pDVar10[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left +
                      (lVar18 - *(int *)((long)&(pDVar10->bytesPerLine).
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)) * 4);
      *piVar1 = *piVar1 + *(int *)((int)pDVar10[1].header._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_color * lVar13 +
                                  *(int *)&pDVar10[1].header._map._M_t._M_impl.super__Rb_tree_header
                                           ._M_header.field_0x4 * lVar18 +
                                  *(long *)&pDVar10[1].header._map._M_t._M_impl);
    }
    pLVar8 = this->_lineBuffer;
  }
  for (; x != iVar14; x = x + local_54) {
    writePtr = *(char **)((this->_lineBuffer->buffer)._data +
                         ((long)x -
                         (long)*(int *)((long)&(this->_lineBuffer->exception).field_2 + 8)) * 0x10 +
                         8);
    uVar16 = 0;
    while( true ) {
      ppLVar2 = (this->_ofd->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_ofd->lineBuffers).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3) <=
          (ulong)uVar16) break;
      pLVar8 = ppLVar2[uVar16];
      iVar6 = Imath_2_5::modp(x,pLVar8->maxY);
      if (iVar6 == 0) {
        if ((char)pLVar8->scanLineMin == '\x01') {
          pDVar10 = this->_ofd;
          fillChannelWithZeroes
                    (&writePtr,(Format)pDVar10->lineOffsetsPosition,
                     (PixelType)(pLVar8->buffer)._size,
                     (ulong)*(uint *)((long)pDVar10[1].header._map._M_t._M_impl.
                                            super__Rb_tree_header._M_header._M_left +
                                     ((long)x -
                                     (long)*(int *)((long)&(pDVar10->bytesPerLine).
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4)) * 4));
        }
        else {
          pDVar10 = this->_ofd;
          copyFromDeepFrameBuffer
                    (&writePtr,(pLVar8->buffer)._data,*(char **)&pDVar10[1].header._map._M_t._M_impl
                     ,(long)(int)pDVar10[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header
                                 ._M_color,
                     (long)*(int *)&pDVar10[1].header._map._M_t._M_impl.super__Rb_tree_header.
                                    _M_header.field_0x4,x,
                     *(int *)((long)&(pDVar10->bytesPerLine).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4),
                     *(int *)&(pDVar10->bytesPerLine).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,0,0,0,0,
                     (ptrdiff_t)pLVar8->dataPtr,*(ptrdiff_t *)&pLVar8->dataSize,
                     (ptrdiff_t)pLVar8->endOfLineBufferData,(Format)pDVar10->lineOffsetsPosition,
                     (PixelType)(pLVar8->buffer)._size);
        }
      }
      uVar16 = uVar16 + 1;
    }
  }
  pLVar8 = this->_lineBuffer;
  iVar6 = *(int *)((long)&(pLVar8->exception).field_2 + 8);
  iVar7 = *(int *)((long)&(pLVar8->exception).field_2 + 0xc);
  if (iVar14 <= iVar7 && iVar6 <= iVar14) {
    return;
  }
  lVar18 = 0;
  size = 0;
  uVar15 = 0;
  for (lVar13 = 0; lVar13 <= iVar7 - iVar6; lVar13 = lVar13 + 1) {
    uVar9 = *(ulong *)((pLVar8->buffer)._data + lVar18);
    size = size + uVar9;
    if (uVar15 < uVar9) {
      uVar15 = uVar9;
    }
    lVar18 = lVar18 + 0x10;
  }
  Array<char>::resizeErase((Array<char> *)&pLVar8->dataPtr,size);
  pLVar8 = this->_lineBuffer;
  lVar13 = 0;
  lVar19 = 0;
  lVar18 = 0;
  while( true ) {
    uVar9 = (ulong)*(int *)((long)&(pLVar8->exception).field_2 + 0xc);
    lVar17 = (long)*(int *)((long)&(pLVar8->exception).field_2 + 8);
    if ((long)(uVar9 - lVar17) < lVar19) break;
    pcVar3 = (pLVar8->buffer)._data;
    memcpy(*(char **)&pLVar8->dataSize + (int)lVar18,*(void **)(pcVar3 + lVar13 + 8),
           *(size_t *)(pcVar3 + lVar13));
    pLVar8 = this->_lineBuffer;
    lVar18 = (long)(int)lVar18 + *(long *)((pLVar8->buffer)._data + lVar13);
    lVar19 = lVar19 + 1;
    lVar13 = lVar13 + 0x10;
  }
  pLVar8->endOfLineBufferData = *(char **)&pLVar8->dataSize;
  pLVar8->scanLineMin = (int)size;
  pLVar8->scanLineMax = (int)((ulong)size >> 0x20);
  pLVar8->minY = (int)size;
  pLVar8->maxY = (int)((ulong)size >> 0x20);
  ptr = *(char **)&pLVar8->partiallyFull;
  uVar20 = 0;
  for (; lVar17 <= (int)uVar9; lVar17 = lVar17 + 1) {
    pDVar10 = this->_ofd;
    iVar14 = 0;
    for (lVar18 = (long)*(int *)((long)&(pDVar10->bytesPerLine).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 4);
        lVar18 <= *(int *)&(pDVar10->bytesPerLine).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage; lVar18 = lVar18 + 1) {
      iVar14 = iVar14 + *(int *)((int)pDVar10[1].header._map._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_color * lVar18 +
                                *(int *)&pDVar10[1].header._map._M_t._M_impl.super__Rb_tree_header.
                                         _M_header.field_0x4 * lVar17 +
                                *(long *)&pDVar10[1].header._map._M_t._M_impl);
      Xdr::write<Imf_2_5::CharPtrIO,char*>(&ptr,iVar14);
      uVar20 = uVar20 + 4;
      pDVar10 = this->_ofd;
    }
    pLVar8 = this->_lineBuffer;
    uVar9 = (ulong)*(uint *)((long)&(pLVar8->exception).field_2 + 0xc);
  }
  plVar4 = (long *)(pLVar8->exception).field_2._M_allocated_capacity;
  if (plVar4 != (long *)0x0) {
    uVar5._0_1_ = pLVar8->partiallyFull;
    uVar5._1_1_ = pLVar8->hasException;
    uVar5._2_6_ = *(undefined6 *)&pLVar8->field_0x42;
    iVar14 = (**(code **)(*plVar4 + 0x20))
                       (plVar4,uVar5,uVar20 & 0xffffffff,
                        *(undefined4 *)((long)&(pLVar8->exception).field_2 + 8),&pLVar8->exception);
    pLVar8 = this->_lineBuffer;
    (pLVar8->exception)._M_string_length = (long)iVar14;
    if (((pLVar8->exception).field_2._M_allocated_capacity != 0) &&
       ((pLVar8->exception)._M_string_length < uVar20)) goto LAB_00157c67;
  }
  (pLVar8->exception)._M_string_length = uVar20;
  (pLVar8->exception)._M_dataplus._M_p = *(pointer *)&pLVar8->partiallyFull;
LAB_00157c67:
  if (*(long **)&pLVar8->field_0x70 != (long *)0x0) {
    (**(code **)(**(long **)&pLVar8->field_0x70 + 8))();
  }
  pCVar11 = Header::compression(&this->_ofd->header);
  pCVar12 = newCompressor(*pCVar11,uVar15,&this->_ofd->header);
  pLVar8 = this->_lineBuffer;
  *(Compressor **)&pLVar8->field_0x70 = pCVar12;
  if (pCVar12 != (Compressor *)0x0) {
    iVar14 = (*pCVar12->_vptr_Compressor[4])
                       (pCVar12,pLVar8->endOfLineBufferData,(ulong)(uint)pLVar8->scanLineMin,
                        (ulong)*(uint *)((long)&(pLVar8->exception).field_2 + 8),&compPtr);
    uVar9 = (ulong)iVar14;
    pLVar8 = this->_lineBuffer;
    uVar15._0_4_ = pLVar8->scanLineMin;
    uVar15._4_4_ = pLVar8->scanLineMax;
    if (uVar9 < uVar15) {
      pLVar8->scanLineMin = (int)uVar9;
      pLVar8->scanLineMax = (int)(uVar9 >> 0x20);
      pLVar8->endOfLineBufferData = compPtr;
    }
    else {
      pDVar10 = this->_ofd;
      if ((int)pDVar10->lineOffsetsPosition == 0) {
        iVar6 = *(int *)((long)&(pLVar8->exception).field_2 + 0xc);
        writePtr = *(char **)&pLVar8->dataSize;
        for (iVar14 = *(int *)((long)&(pLVar8->exception).field_2 + 8); iVar14 <= iVar6;
            iVar14 = iVar14 + 1) {
          local_40 = writePtr;
          uVar16 = 0;
          while( true ) {
            ppLVar2 = (pDVar10->lineBuffers).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(pDVar10->lineBuffers).
                              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3) <=
                (ulong)uVar16) break;
            pLVar8 = ppLVar2[uVar16];
            iVar7 = Imath_2_5::modp(iVar14,pLVar8->maxY);
            if (iVar7 == 0) {
              convertInPlace(&writePtr,&local_40,(PixelType)(pLVar8->buffer)._size,
                             (long)*(int *)((long)pDVar10[1].header._map._M_t._M_impl.
                                                  super__Rb_tree_header._M_header._M_left +
                                           ((long)iVar14 -
                                           (long)*(int *)((long)&(pDVar10->bytesPerLine).
                                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4)) * 4));
            }
            uVar16 = uVar16 + 1;
          }
        }
        pLVar8 = this->_lineBuffer;
      }
    }
  }
  pLVar8->field_0x78 = 0;
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //

        if (_lineBuffer->uncompressedData == 0)
        {
            Int64 uncompressedSize = 0;
            int maxY = min (_lineBuffer->maxY, _ifd->maxY);

            for (int i = _lineBuffer->minY - _ifd->minY;
                 i <= maxY - _ifd->minY;
                 ++i)
            {
                uncompressedSize += (int) _ifd->bytesPerLine[i];
            }

            //
            // Create the compressor everytime when we want to use it,
            // because we don't know maxBytesPerLine beforehand.
            // (TODO) optimize this. don't do this every time.
            //

            if (_lineBuffer->compressor != 0)
                delete _lineBuffer->compressor;
            Int64 maxBytesPerLine = 0;
            for (int i = _lineBuffer->minY - _ifd->minY;
                 i <= maxY - _ifd->minY;
                 ++i)
            {
                if (_ifd->bytesPerLine[i] > maxBytesPerLine)
                    maxBytesPerLine = _ifd->bytesPerLine[i];
            }
            _lineBuffer->compressor = newCompressor(_ifd->header.compression(),
                                                    maxBytesPerLine,
                                                    _ifd->header);

            if (_lineBuffer->compressor &&
                _lineBuffer->packedDataSize < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format();

                _lineBuffer->packedDataSize = _lineBuffer->compressor->uncompress
                    (_lineBuffer->buffer, _lineBuffer->packedDataSize,
                     _lineBuffer->minY, _lineBuffer->uncompressedData);
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //

                _lineBuffer->format = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;
            }
        }

        int yStart, yStop, dy;

        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop = _scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop = _scanLineMin - 1;
            dy = -1;
        }

        for (int y = yStart; y != yStop; y += dy)
        {
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //

            const char *readPtr = _lineBuffer->uncompressedData +
                                  _ifd->offsetInLineBuffer[y - _ifd->minY];

            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size(); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                InSliceInfo &slice = *_ifd->slices[i];

                if (modp (y, slice.ySampling) != 0)
                    continue;

                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (readPtr, slice.typeInFile,
                                 _ifd->lineSampleCount[y - _ifd->minY]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    int width = (_ifd->maxX - _ifd->minX + 1);

                    copyIntoDeepFrameBuffer (readPtr, slice.base,
                                             (char*) (&_ifd->sampleCount[0][0]
                                                      - _ifd->minX
                                                      - _ifd->minY * width),
                                             sizeof(unsigned int) * 1,
                                             sizeof(unsigned int) * width,
                                             y, _ifd->minX, _ifd->maxX,
                                             0, 0,
                                             0, 0,
                                             slice.sampleStride, 
                                             slice.xPointerStride,
                                             slice.yPointerStride,
                                             slice.fill,
                                             slice.fillValue, _lineBuffer->format,
                                             slice.typeInFrameBuffer,
                                             slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}